

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O2

int zddReorderPostprocess(DdManager *table)

{
  uint uVar1;
  DdSubtable *pDVar2;
  DdNode **__ptr;
  DdNode *pDVar3;
  ulong uVar4;
  _func_void_long *p_Var5;
  DdNode **ppDVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  DdNode *pDVar10;
  uint uVar11;
  uint uVar12;
  
  ppDVar6 = (DdNode **)(table->allocated / 2);
  if (table->reclaimed <= (double)(long)ppDVar6) {
    for (lVar8 = 0; p_Var5 = Extra_UtilMMoutOfMemory, ppDVar6 = (DdNode **)(long)table->sizeZ,
        Extra_UtilMMoutOfMemory = p_Var5, lVar8 < (long)ppDVar6; lVar8 = lVar8 + 1) {
      pDVar2 = table->subtableZ;
      uVar1 = pDVar2[lVar8].slots;
      if ((pDVar2[lVar8].keys << 3 <= uVar1) && (table->initSlots < uVar1)) {
        __ptr = pDVar2[lVar8].nodelist;
        uVar12 = uVar1 >> 1;
        ppDVar6 = (DdNode **)malloc((ulong)uVar12 * 8);
        Extra_UtilMMoutOfMemory = p_Var5;
        if (ppDVar6 == (DdNode **)0x0) break;
        pDVar2[lVar8].nodelist = ppDVar6;
        pDVar2[lVar8].slots = uVar12;
        iVar7 = pDVar2[lVar8].shift + 1;
        pDVar2[lVar8].shift = iVar7;
        pDVar2[lVar8].maxKeys = uVar12 * 4;
        for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
          ppDVar6[uVar9] = (DdNode *)0x0;
        }
        for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
          pDVar10 = __ptr[uVar9];
          while (pDVar10 != (DdNode *)0x0) {
            pDVar3 = pDVar10->next;
            uVar4 = *(ulong *)((long)&pDVar10->type + 8);
            uVar11 = (((uint)uVar4 & 1) + *(int *)((uVar4 & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)*(ulong *)&pDVar10->type & 1) +
                     *(int *)((*(ulong *)&pDVar10->type & 0xfffffffffffffffe) + 0x20) * 2) *
                     0xc00005) * 0x40f1f9 >> ((byte)iVar7 & 0x1f);
            pDVar10->next = ppDVar6[(int)uVar11];
            ppDVar6[(int)uVar11] = pDVar10;
            pDVar10 = pDVar3;
          }
        }
        free(__ptr);
        table->memused = table->memused + (ulong)(uVar12 - uVar1) * 8;
        uVar12 = (uVar12 - uVar1) + table->slots;
        table->slots = uVar12;
        table->minDead = (uint)(long)((double)uVar12 * table->gcFrac);
        uVar1 = uVar12 * 4;
        if (table->maxCacheHard <= uVar12 * 4) {
          uVar1 = table->maxCacheHard;
        }
        table->cacheSlack = uVar1 + table->cacheSlots * -2;
      }
    }
  }
  return (int)ppDVar6;
}

Assistant:

static int
zddReorderPostprocess(
  DdManager * table)
{
    int i, j, posn;
    DdNodePtr *nodelist, *oldnodelist;
    DdNode *node, *next;
    unsigned int slots, oldslots;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

#ifdef DD_VERBOSE
    (void) fflush(table->out);
#endif

    /* If we have very many reclaimed nodes, we do not want to shrink
    ** the subtables, because this will lead to more garbage
    ** collections. More garbage collections mean shorter mean life for
    ** nodes with zero reference count; hence lower probability of finding
    ** a result in the cache.
    */
    if (table->reclaimed > table->allocated / 2) return(1);

    /* Resize subtables. */
    for (i = 0; i < table->sizeZ; i++) {
        int shift;
        oldslots = table->subtableZ[i].slots;
        if (oldslots < table->subtableZ[i].keys * DD_MAX_SUBTABLE_SPARSITY ||
            oldslots <= table->initSlots) continue;
        oldnodelist = table->subtableZ[i].nodelist;
        slots = oldslots >> 1;
        saveHandler = MMoutOfMemory;
        MMoutOfMemory = Cudd_OutOfMem;
        nodelist = ABC_ALLOC(DdNodePtr, slots);
        MMoutOfMemory = saveHandler;
        if (nodelist == NULL) {
            return(1);
        }
        table->subtableZ[i].nodelist = nodelist;
        table->subtableZ[i].slots = slots;
        table->subtableZ[i].shift++;
        table->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
#ifdef DD_VERBOSE
        (void) fprintf(table->err,
                       "shrunk layer %d (%d keys) from %d to %d slots\n",
                       i, table->subtableZ[i].keys, oldslots, slots);
#endif

        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        shift = table->subtableZ[i].shift;
        for (j = 0; (unsigned) j < oldslots; j++) {
            node = oldnodelist[j];
            while (node != NULL) {
                next = node->next;
                posn = ddHash(cuddF2L(cuddT(node)), cuddF2L(cuddE(node)), shift);
                node->next = nodelist[posn];
                nodelist[posn] = node;
                node = next;
            }
        }
        ABC_FREE(oldnodelist);

        table->memused += (slots - oldslots) * sizeof(DdNode *);
        table->slots += slots - oldslots;
        table->minDead = (unsigned) (table->gcFrac * (double) table->slots);
        table->cacheSlack = (int) ddMin(table->maxCacheHard,
            DD_MAX_CACHE_TO_SLOTS_RATIO*table->slots) -
            2 * (int) table->cacheSlots;
    }
    /* We don't look at the constant subtable, because it is not
    ** affected by reordering.
    */

    return(1);

}